

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::legacy_tex_op
          (string *__return_storage_ptr__,CompilerGLSL *this,string *op,SPIRType *imgtype,
          uint32_t tex)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  SPIREntryPoint *pSVar5;
  CompilerError *this_00;
  runtime_error *prVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  byte bVar8;
  char *pcVar9;
  uint32_t uVar10;
  undefined4 in_register_00000084;
  char *type;
  string type_prefix;
  undefined1 local_80 [8];
  string local_78;
  undefined4 local_54;
  string local_50;
  
  switch((imgtype->image).dim) {
  case Dim1D:
    if ((this->options).es == true) goto switchD_002e60db_caseD_6;
    local_80 = (undefined1  [8])0x382be4;
    if ((imgtype->image).arrayed != false) {
      local_80 = (undefined1  [8])0x3ab1a7;
    }
    break;
  case Dim2D:
    local_80 = (undefined1  [8])0x3ab1be;
    if (((this->options).es & 1U) != 0) {
      local_80 = (undefined1  [8])0x370d7b;
    }
    if ((imgtype->image).arrayed == false) {
      local_80 = (undefined1  [8])0x370d7b;
    }
    break;
  case Dim3D:
    local_80 = (undefined1  [8])0x3ab1f4;
    break;
  case Cube:
    local_80 = (undefined1  [8])0x370219;
    break;
  case DimRect:
    local_80 = (undefined1  [8])0x3ab1e7;
    break;
  case Buffer:
    local_80 = (undefined1  [8])0x36ec77;
    break;
  case DimSubpassData:
switchD_002e60db_caseD_6:
    local_80 = (undefined1  [8])0x370d7b;
    break;
  default:
    local_80 = (undefined1  [8])0x35ca19;
  }
  uVar10 = tex;
  pSVar5 = Compiler::get_entry_point(&this->super_Compiler);
  iVar4 = ::std::__cxx11::string::compare((char *)op);
  if ((iVar4 == 0) || (iVar4 = ::std::__cxx11::string::compare((char *)op), iVar4 == 0)) {
LAB_002e61ca:
    bVar3 = (this->options).es;
    uVar2 = (this->options).version;
    uVar7 = (ulong)uVar2;
    if ((uVar2 < 300 & bVar3) == 1) {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_80 + 8),"GL_EXT_shader_texture_lod","");
      require_extension_internal(this,(string *)(local_80 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71((int7)(uVar7 >> 8),1);
    }
    else {
      if (bVar3 == false && uVar2 < 0x82) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_80 + 8),"GL_ARB_shader_texture_lod","");
        require_extension_internal(this,(string *)(local_80 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
      }
LAB_002e6273:
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  else {
    iVar4 = ::std::__cxx11::string::compare((char *)op);
    if (iVar4 == 0) {
      if (pSVar5->model != ExecutionModelVertex) goto LAB_002e61ca;
      goto LAB_002e6273;
    }
    iVar4 = ::std::__cxx11::string::compare((char *)op);
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((iVar4 == 0) && (pSVar5->model != ExecutionModelVertex)) goto LAB_002e61ca;
  }
  local_54 = SUB84(ts_1,0);
  iVar4 = ::std::__cxx11::string::compare((char *)op);
  if ((iVar4 == 0) || (iVar4 = ::std::__cxx11::string::compare((char *)op), iVar4 == 0)) {
    if (((this->options).es == true) && ((this->options).version < 300)) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      join<std::__cxx11::string_const&,char_const(&)[26]>
                ((string *)(local_80 + 8),(spirv_cross *)op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " not allowed in legacy ES",(char (*) [26])ts_1);
      ::std::runtime_error::runtime_error(prVar6,(string *)(local_80 + 8));
      *(undefined ***)prVar6 = &PTR__runtime_error_0049deb0;
      __cxa_throw(prVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_80 + 8),"GL_EXT_gpu_shader4","");
    require_extension_internal(this,(string *)(local_80 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  bVar3 = Compiler::is_depth_image(&this->super_Compiler,imgtype,tex);
  if (((bVar3) && ((this->options).es == true)) && ((this->options).version < 300)) {
    iVar4 = ::std::__cxx11::string::compare((char *)op);
    if ((iVar4 != 0) && (iVar4 = ::std::__cxx11::string::compare((char *)op), iVar4 != 0)) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      join<std::__cxx11::string_const&,char_const(&)[44]>
                ((string *)(local_80 + 8),(spirv_cross *)op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " not allowed on depth samplers in legacy ES",(char (*) [44])ts_1);
      ::std::runtime_error::runtime_error(prVar6,(string *)(local_80 + 8));
      *(undefined ***)prVar6 = &PTR__runtime_error_0049deb0;
      __cxa_throw(prVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_80 + 8),"GL_EXT_shadow_samplers","");
    require_extension_internal(this,(string *)(local_80 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((imgtype->image).dim == Cube) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"shadowCubeNV","");
      return __return_storage_ptr__;
    }
  }
  iVar4 = ::std::__cxx11::string::compare((char *)op);
  if (iVar4 == 0) {
    if (((this->options).es == true) && ((this->options).version < 300)) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"textureSize not supported in legacy ES");
      goto LAB_002e688e;
    }
    if (bVar3) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"textureSize not supported on shadow sampler in legacy GLSL");
      goto LAB_002e688e;
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_80 + 8),"GL_EXT_gpu_shader4","");
    require_extension_internal(this,(string *)(local_80 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  iVar4 = ::std::__cxx11::string::compare((char *)op);
  if (((iVar4 != 0) || ((this->options).es != true)) || (299 < (this->options).version)) {
    uVar2 = (this->options).version;
    bVar1 = (this->options).es;
    pcVar9 = "texture";
    if (bVar3) {
      pcVar9 = "shadow";
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_80 + 8),pcVar9,pcVar9 + ((ulong)bVar3 ^ 7));
    bVar8 = bVar3 & uVar2 < 300 & bVar1;
    iVar4 = ::std::__cxx11::string::compare((char *)op);
    if (iVar4 == 0) {
      if (bVar8 == 0) {
        join<std::__cxx11::string&,char_const*&>
                  (__return_storage_ptr__,(spirv_cross *)(local_80 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   (char **)ts_1);
      }
      else {
        join<std::__cxx11::string&,char_const*&,char_const(&)[4]>
                  (__return_storage_ptr__,(spirv_cross *)(local_80 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   (char **)0x38bc79,(char (*) [4])CONCAT44(in_register_00000084,uVar10));
      }
    }
    else {
      iVar4 = ::std::__cxx11::string::compare((char *)op);
      if (iVar4 == 0) {
        local_50._M_dataplus._M_p = "Lod";
        if ((char)local_54 != '\0') {
          local_50._M_dataplus._M_p = "LodEXT";
        }
        join<std::__cxx11::string&,char_const*&,char_const*>
                  (__return_storage_ptr__,(spirv_cross *)(local_80 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   (char **)&local_50,(char **)CONCAT44(in_register_00000084,uVar10));
      }
      else {
        iVar4 = ::std::__cxx11::string::compare((char *)op);
        if (iVar4 == 0) {
          local_50._M_dataplus._M_p = "Proj";
          if (bVar8 != 0) {
            local_50._M_dataplus._M_p = "ProjEXT";
          }
          join<std::__cxx11::string&,char_const*&,char_const*>
                    (__return_storage_ptr__,(spirv_cross *)(local_80 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     (char **)&local_50,(char **)CONCAT44(in_register_00000084,uVar10));
        }
        else {
          iVar4 = ::std::__cxx11::string::compare((char *)op);
          if (iVar4 == 0) {
            uVar2 = (this->options).version;
            pcVar9 = "GradARB";
            if (0x81 < uVar2) {
              pcVar9 = "Grad";
            }
            bVar3 = (this->options).es;
            if (bVar3 != false) {
              pcVar9 = "Grad";
            }
            local_50._M_dataplus._M_p = "GradEXT";
            if (299 < uVar2) {
              local_50._M_dataplus._M_p = pcVar9;
            }
            if (bVar3 == false) {
              local_50._M_dataplus._M_p = pcVar9;
            }
            join<std::__cxx11::string&,char_const*&,char_const*>
                      (__return_storage_ptr__,(spirv_cross *)(local_80 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                       ,(char **)&local_50,(char **)CONCAT44(in_register_00000084,uVar10));
          }
          else {
            iVar4 = ::std::__cxx11::string::compare((char *)op);
            if (iVar4 == 0) {
              local_50._M_dataplus._M_p = "ProjLod";
              if ((char)local_54 != '\0') {
                local_50._M_dataplus._M_p = "ProjLodEXT";
              }
              join<std::__cxx11::string&,char_const*&,char_const*>
                        (__return_storage_ptr__,(spirv_cross *)(local_80 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80,(char **)&local_50,(char **)CONCAT44(in_register_00000084,uVar10))
              ;
            }
            else {
              iVar4 = ::std::__cxx11::string::compare((char *)op);
              if (iVar4 == 0) {
                join<std::__cxx11::string&,char_const*&,char_const(&)[10]>
                          (__return_storage_ptr__,(spirv_cross *)(local_80 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_80,(char **)0x3aaf1c,
                           (char (*) [10])CONCAT44(in_register_00000084,uVar10));
              }
              else {
                iVar4 = ::std::__cxx11::string::compare((char *)op);
                if (iVar4 == 0) {
                  uVar2 = (this->options).version;
                  pcVar9 = "ProjGradARB";
                  if (0x81 < uVar2) {
                    pcVar9 = "ProjGrad";
                  }
                  bVar3 = (this->options).es;
                  if (bVar3 != false) {
                    pcVar9 = "ProjGrad";
                  }
                  local_50._M_dataplus._M_p = "ProjGradEXT";
                  if (299 < uVar2) {
                    local_50._M_dataplus._M_p = pcVar9;
                  }
                  if (bVar3 == false) {
                    local_50._M_dataplus._M_p = pcVar9;
                  }
                  join<std::__cxx11::string&,char_const*&,char_const*>
                            (__return_storage_ptr__,(spirv_cross *)(local_80 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_80,(char **)&local_50,
                             (char **)CONCAT44(in_register_00000084,uVar10));
                }
                else {
                  iVar4 = ::std::__cxx11::string::compare((char *)op);
                  if (iVar4 == 0) {
                    join<std::__cxx11::string&,char_const*&,char_const(&)[14]>
                              (__return_storage_ptr__,(spirv_cross *)(local_80 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_80,(char **)0x3aaf7c,
                               (char (*) [14])CONCAT44(in_register_00000084,uVar10));
                  }
                  else {
                    iVar4 = ::std::__cxx11::string::compare((char *)op);
                    if (iVar4 == 0) {
                      join<char_const(&)[12],char_const*&>
                                (__return_storage_ptr__,(spirv_cross *)"textureSize",
                                 (char (*) [12])local_80,(char **)ts_1);
                    }
                    else {
                      iVar4 = ::std::__cxx11::string::compare((char *)op);
                      if (iVar4 != 0) {
                        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                        join<char_const(&)[32],std::__cxx11::string_const&>
                                  (&local_50,(spirv_cross *)"Unsupported legacy texture op: ",
                                   (char (*) [32])op,ts_1);
                        ::std::runtime_error::runtime_error(prVar6,(string *)&local_50);
                        *(undefined ***)prVar6 = &PTR__runtime_error_0049deb0;
                        __cxa_throw(prVar6,&CompilerError::typeinfo,
                                    ::std::runtime_error::~runtime_error);
                      }
                      join<char_const(&)[11],char_const*&>
                                (__return_storage_ptr__,(spirv_cross *)"texelFetch",
                                 (char (*) [11])local_80,(char **)ts_1);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError(this_00,"texelFetch not supported in legacy ES");
LAB_002e688e:
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string CompilerGLSL::legacy_tex_op(const std::string &op, const SPIRType &imgtype, uint32_t tex)
{
	const char *type;
	switch (imgtype.image.dim)
	{
	case spv::Dim1D:
		// Force 2D path for ES.
		if (options.es)
			type = (imgtype.image.arrayed && !options.es) ? "2DArray" : "2D";
		else
			type = (imgtype.image.arrayed && !options.es) ? "1DArray" : "1D";
		break;
	case spv::Dim2D:
		type = (imgtype.image.arrayed && !options.es) ? "2DArray" : "2D";
		break;
	case spv::Dim3D:
		type = "3D";
		break;
	case spv::DimCube:
		type = "Cube";
		break;
	case spv::DimRect:
		type = "2DRect";
		break;
	case spv::DimBuffer:
		type = "Buffer";
		break;
	case spv::DimSubpassData:
		type = "2D";
		break;
	default:
		type = "";
		break;
	}

	// In legacy GLSL, an extension is required for textureLod in the fragment
	// shader or textureGrad anywhere.
	bool legacy_lod_ext = false;
	auto &execution = get_entry_point();
	if (op == "textureGrad" || op == "textureProjGrad" ||
	    ((op == "textureLod" || op == "textureProjLod") && execution.model != ExecutionModelVertex))
	{
		if (is_legacy_es())
		{
			legacy_lod_ext = true;
			require_extension_internal("GL_EXT_shader_texture_lod");
		}
		else if (is_legacy_desktop())
			require_extension_internal("GL_ARB_shader_texture_lod");
	}

	if (op == "textureLodOffset" || op == "textureProjLodOffset")
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW(join(op, " not allowed in legacy ES"));

		require_extension_internal("GL_EXT_gpu_shader4");
	}

	// GLES has very limited support for shadow samplers.
	// Basically shadow2D and shadow2DProj work through EXT_shadow_samplers,
	// everything else can just throw
	bool is_comparison = is_depth_image(imgtype, tex);
	if (is_comparison && is_legacy_es())
	{
		if (op == "texture" || op == "textureProj")
			require_extension_internal("GL_EXT_shadow_samplers");
		else
			SPIRV_CROSS_THROW(join(op, " not allowed on depth samplers in legacy ES"));

		if (imgtype.image.dim == spv::DimCube)
			return "shadowCubeNV";
	}

	if (op == "textureSize")
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("textureSize not supported in legacy ES");
		if (is_comparison)
			SPIRV_CROSS_THROW("textureSize not supported on shadow sampler in legacy GLSL");
		require_extension_internal("GL_EXT_gpu_shader4");
	}

	if (op == "texelFetch" && is_legacy_es())
		SPIRV_CROSS_THROW("texelFetch not supported in legacy ES");

	bool is_es_and_depth = is_legacy_es() && is_comparison;
	std::string type_prefix = is_comparison ? "shadow" : "texture";

	if (op == "texture")
		return is_es_and_depth ? join(type_prefix, type, "EXT") : join(type_prefix, type);
	else if (op == "textureLod")
		return join(type_prefix, type, legacy_lod_ext ? "LodEXT" : "Lod");
	else if (op == "textureProj")
		return join(type_prefix, type, is_es_and_depth ? "ProjEXT" : "Proj");
	else if (op == "textureGrad")
		return join(type_prefix, type, is_legacy_es() ? "GradEXT" : is_legacy_desktop() ? "GradARB" : "Grad");
	else if (op == "textureProjLod")
		return join(type_prefix, type, legacy_lod_ext ? "ProjLodEXT" : "ProjLod");
	else if (op == "textureLodOffset")
		return join(type_prefix, type, "LodOffset");
	else if (op == "textureProjGrad")
		return join(type_prefix, type,
		            is_legacy_es() ? "ProjGradEXT" : is_legacy_desktop() ? "ProjGradARB" : "ProjGrad");
	else if (op == "textureProjLodOffset")
		return join(type_prefix, type, "ProjLodOffset");
	else if (op == "textureSize")
		return join("textureSize", type);
	else if (op == "texelFetch")
		return join("texelFetch", type);
	else
	{
		SPIRV_CROSS_THROW(join("Unsupported legacy texture op: ", op));
	}
}